

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void apply_aug(lys_node_augment *augment)

{
  ushort uVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  lys_node *plVar4;
  
  plVar2 = augment->target;
  if ((plVar2 != (lys_node *)0x0) && (uVar1 = augment->flags, (uVar1 & 1) != 0)) {
    plVar3 = plVar2->child;
    if (plVar3 == (lys_node *)0x0) {
      plVar2->child = augment->child;
    }
    else {
      plVar2 = plVar3->prev;
      plVar4 = augment->child;
      plVar2->next = plVar4;
      plVar3->prev = plVar4->prev;
      plVar4->prev = plVar2;
    }
    augment->flags = uVar1 & 0xfffe;
    return;
  }
  __assert_fail("augment->target && (augment->flags & LYS_NOTAPPLIED)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0xfb1,"void apply_aug(struct lys_node_augment *)");
}

Assistant:

static void
apply_aug(struct lys_node_augment *augment)
{
    struct lys_node *last;

    assert(augment->target && (augment->flags & LYS_NOTAPPLIED));

    /* reconnect augmenting data into the target - add them to the target child list */
    if (augment->target->child) {
        last = augment->target->child->prev;
        last->next = augment->child;
        augment->target->child->prev = augment->child->prev;
        augment->child->prev = last;
    } else {
        augment->target->child = augment->child;
    }

    /* remove the flag about not applicability */
    augment->flags &= ~LYS_NOTAPPLIED;
}